

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O1

int StrListIndex(tchar_t *s,tchar_t *List)

{
  bool bVar1;
  int iVar2;
  size_t n;
  char *pcVar3;
  int unaff_EBX;
  int i;
  
  if ((List != (tchar_t *)0x0) && (*List != '\0')) {
    n = strlen(s);
    bVar1 = true;
    if (n != 0) {
      unaff_EBX = 0;
      do {
        iVar2 = tcsnicmp_ascii(List,s,n);
        if (((iVar2 == 0) && ((ulong)(byte)List[n] < 0x2d)) &&
           ((0x100100000001U >> ((ulong)(byte)List[n] & 0x3f) & 1) != 0)) {
          bVar1 = false;
          break;
        }
        pcVar3 = strchr(List,0x2c);
        List = pcVar3 + 1;
        unaff_EBX = unaff_EBX + 1;
      } while (pcVar3 != (char *)0x0);
    }
    if (!bVar1) {
      return unaff_EBX;
    }
  }
  return -1;
}

Assistant:

int StrListIndex(const tchar_t* s, const tchar_t* List)
{
	if (List && *List)
	{
		size_t n = tcslen(s);
		if (n)
		{
			int i=0;
			while (List)
			{
				if (tcsnicmp_ascii(List,s,n)==0 && (!List[n] || List[n]==',' || List[n]==' '))
					return i;
				List = tcschr(List,T(','));
				if (List) ++List;
				++i;
			}
		}
	}
	return -1;
}